

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.cpp
# Opt level: O0

int mbedtls_asn1_get_bitstring_null(uchar **p,uchar *end,size_t *len)

{
  long *in_RDX;
  uchar **in_RSI;
  long *in_RDI;
  int ret;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  local_4 = mbedtls_asn1_get_tag
                      (in_RSI,(uchar *)in_RDX,
                       (size_t *)CONCAT44(0xffffff92,in_stack_ffffffffffffffd8),0);
  if (local_4 == 0) {
    if (*in_RDX == 0) {
      local_4 = -0x68;
    }
    else {
      *in_RDX = *in_RDX + -1;
      if (*(char *)*in_RDI == '\0') {
        *in_RDI = *in_RDI + 1;
        local_4 = 0;
      }
      else {
        local_4 = -0x68;
      }
    }
  }
  return local_4;
}

Assistant:

int mbedtls_asn1_get_bitstring_null(unsigned char **p, const unsigned char *end,
                                    size_t *len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if ((ret = mbedtls_asn1_get_tag(p, end, len, MBEDTLS_ASN1_BIT_STRING)) != 0) {
        return ret;
    }

    if (*len == 0) {
        return MBEDTLS_ERR_ASN1_INVALID_DATA;
    }
    --(*len);

    if (**p != 0) {
        return MBEDTLS_ERR_ASN1_INVALID_DATA;
    }
    ++(*p);

    return 0;
}